

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue_basic_tests.cpp
# Opt level: O3

void density_tests::heterogeneous_queue_basic_polymorphic_base_tests(void)

{
  ulong uVar1;
  uintptr_t *puVar2;
  ControlBlock *pCVar3;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  *__range1;
  int iVar4;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  queue;
  iterator __begin1;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  local_f8;
  reentrant_consume_operation local_e8;
  consume_operation local_d8;
  reentrant_consume_operation local_c8;
  consume_operation local_b8;
  reentrant_consume_operation local_a8;
  consume_operation local_98;
  reentrant_consume_operation local_88;
  consume_operation local_78;
  reentrant_consume_operation local_68;
  consume_operation local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [24];
  
  local_f8.m_head = (ControlBlock *)&DAT_0000ffef;
  local_f8.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_48._0_8_ = (ControlBlock *)0x0;
  local_38._0_8_ = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_38._8_8_ = (tuple_type *)0x0;
  local_48._8_8_ = (NonPolymorphicBase)0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_48 + 0xc));
  local_48._0_8_ = &PTR_class_id_01067338;
  local_38._0_8_ = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x4036000000000000;
  InstanceCounted::new_instance((InstanceCounted *)(local_38 + 8));
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
  ::emplace<density_tests::PolymorphicBase,density_tests::PolymorphicBase>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
              *)&local_f8,(PolymorphicBase *)local_48);
  PolymorphicBase::~PolymorphicBase((PolymorphicBase *)local_48);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_emplace<density_tests::SingleDerived>(&local_f8);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::emplace<density_tests::Derived1>(&local_f8);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_emplace<density_tests::Derived2>(&local_f8);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::emplace<density_tests::MultipleDerived>(&local_f8);
  dynamic_push_3<density_tests::PolymorphicBase,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&local_f8);
  dynamic_push_3<density_tests::SingleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&local_f8);
  dynamic_push_3<density_tests::Derived1,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&local_f8);
  dynamic_push_3<density_tests::Derived2,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&local_f8);
  dynamic_push_3<density_tests::MultipleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
            (&local_f8);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::begin((iterator *)local_48,&local_f8);
  if ((ControlBlock *)local_48._0_8_ != (ControlBlock *)0x0) {
    iVar4 = 0x14;
    do {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
      ::iterator::operator++((iterator *)local_48);
      iVar4 = iVar4 + -1;
    } while ((ControlBlock *)local_48._0_8_ != (ControlBlock *)0x0);
    local_58.m_control = local_f8.m_head;
    if (iVar4 == 0) goto joined_r0x00e13c5b;
  }
  detail::assert_failed<>
            ("elements == put_count",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
             ,0xbb);
  local_58.m_control = local_f8.m_head;
joined_r0x00e13c5b:
  while (local_58.m_control != local_f8.m_tail) {
    uVar1 = (local_58.m_control)->m_next;
    if ((uVar1 & 3) == 0) {
      (local_58.m_control)->m_next = uVar1 | 1;
      goto LAB_00e13c7c;
    }
    local_58.m_control = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  }
  local_58.m_control = (ControlBlock *)0x0;
LAB_00e13c7c:
  local_58.m_queue = &local_f8;
  polymorphic_consume<density_tests::PolymorphicBase,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
            (&local_58);
  local_68.m_control = local_f8.m_head;
  if (local_58.m_control != (ControlBlock *)0x0) {
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::cancel_consume_impl(local_58.m_queue,local_58.m_control);
    local_68.m_control = local_f8.m_head;
  }
  while (local_68.m_control != local_f8.m_tail) {
    uVar1 = (local_68.m_control)->m_next;
    if ((uVar1 & 3) == 0) {
      (local_68.m_control)->m_next = uVar1 | 1;
      goto LAB_00e13cd7;
    }
    local_68.m_control = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  }
  local_68.m_control = (ControlBlock *)0x0;
LAB_00e13cd7:
  local_68.m_queue = &local_f8;
  polymorphic_consume<density_tests::SingleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
            (&local_68);
  local_78.m_control = local_f8.m_head;
  if (local_68.m_control != (ControlBlock *)0x0) {
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::cancel_consume_impl(local_68.m_queue,local_68.m_control);
    local_78.m_control = local_f8.m_head;
  }
  while (local_78.m_control != local_f8.m_tail) {
    uVar1 = (local_78.m_control)->m_next;
    if ((uVar1 & 3) == 0) {
      (local_78.m_control)->m_next = uVar1 | 1;
      goto LAB_00e13d32;
    }
    local_78.m_control = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  }
  local_78.m_control = (ControlBlock *)0x0;
LAB_00e13d32:
  local_78.m_queue = &local_f8;
  polymorphic_consume<density_tests::Derived1,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
            (&local_78);
  local_88.m_control = local_f8.m_head;
  if (local_78.m_control != (ControlBlock *)0x0) {
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::cancel_consume_impl(local_78.m_queue,local_78.m_control);
    local_88.m_control = local_f8.m_head;
  }
  while (local_88.m_control != local_f8.m_tail) {
    uVar1 = (local_88.m_control)->m_next;
    if ((uVar1 & 3) == 0) {
      (local_88.m_control)->m_next = uVar1 | 1;
      goto LAB_00e13d8d;
    }
    local_88.m_control = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  }
  local_88.m_control = (ControlBlock *)0x0;
LAB_00e13d8d:
  local_88.m_queue = &local_f8;
  polymorphic_consume<density_tests::Derived2,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
            (&local_88);
  local_98.m_control = local_f8.m_head;
  if (local_88.m_control != (ControlBlock *)0x0) {
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::cancel_consume_impl(local_88.m_queue,local_88.m_control);
    local_98.m_control = local_f8.m_head;
  }
  while (local_98.m_control != local_f8.m_tail) {
    uVar1 = (local_98.m_control)->m_next;
    if ((uVar1 & 3) == 0) {
      (local_98.m_control)->m_next = uVar1 | 1;
      goto LAB_00e13ddf;
    }
    local_98.m_control = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  }
  local_98.m_control = (ControlBlock *)0x0;
LAB_00e13ddf:
  local_98.m_queue = &local_f8;
  polymorphic_consume<density_tests::MultipleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
            (&local_98);
  if (local_98.m_control != (ControlBlock *)0x0) {
    density::
    heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
    ::cancel_consume_impl(local_98.m_queue,local_98.m_control);
  }
  iVar4 = 0;
  pCVar3 = local_f8.m_head;
joined_r0x00e13e18:
  do {
    local_a8.m_control = pCVar3;
    if (local_a8.m_control == local_f8.m_tail) {
      local_a8.m_control = (ControlBlock *)0x0;
    }
    else {
      uVar1 = (local_a8.m_control)->m_next;
      if ((uVar1 & 3) != 0) {
        pCVar3 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
        goto joined_r0x00e13e18;
      }
      (local_a8.m_control)->m_next = uVar1 | 1;
    }
    local_a8.m_queue = &local_f8;
    polymorphic_consume<density_tests::PolymorphicBase,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
              (&local_a8);
    if (local_a8.m_control != (ControlBlock *)0x0) {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
      ::cancel_consume_impl(local_a8.m_queue,local_a8.m_control);
    }
    iVar4 = iVar4 + 1;
    pCVar3 = local_f8.m_head;
  } while (iVar4 != 3);
  iVar4 = 0;
  pCVar3 = local_f8.m_head;
joined_r0x00e13e7c:
  do {
    local_b8.m_control = pCVar3;
    if (local_b8.m_control == local_f8.m_tail) {
      local_b8.m_control = (ControlBlock *)0x0;
    }
    else {
      uVar1 = (local_b8.m_control)->m_next;
      if ((uVar1 & 3) != 0) {
        pCVar3 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
        goto joined_r0x00e13e7c;
      }
      (local_b8.m_control)->m_next = uVar1 | 1;
    }
    local_b8.m_queue = &local_f8;
    polymorphic_consume<density_tests::SingleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
              (&local_b8);
    if (local_b8.m_control != (ControlBlock *)0x0) {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
      ::cancel_consume_impl(local_b8.m_queue,local_b8.m_control);
    }
    iVar4 = iVar4 + 1;
    pCVar3 = local_f8.m_head;
  } while (iVar4 != 3);
  iVar4 = 0;
  pCVar3 = local_f8.m_head;
joined_r0x00e13ee0:
  do {
    local_c8.m_control = pCVar3;
    if (local_c8.m_control == local_f8.m_tail) {
      local_c8.m_control = (ControlBlock *)0x0;
    }
    else {
      uVar1 = (local_c8.m_control)->m_next;
      if ((uVar1 & 3) != 0) {
        pCVar3 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
        goto joined_r0x00e13ee0;
      }
      (local_c8.m_control)->m_next = uVar1 | 1;
    }
    local_c8.m_queue = &local_f8;
    polymorphic_consume<density_tests::Derived1,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
              (&local_c8);
    if (local_c8.m_control != (ControlBlock *)0x0) {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
      ::cancel_consume_impl(local_c8.m_queue,local_c8.m_control);
    }
    iVar4 = iVar4 + 1;
    pCVar3 = local_f8.m_head;
  } while (iVar4 != 3);
  iVar4 = 0;
  pCVar3 = local_f8.m_head;
joined_r0x00e13f44:
  do {
    local_d8.m_control = pCVar3;
    if (local_d8.m_control == local_f8.m_tail) {
      local_d8.m_control = (ControlBlock *)0x0;
    }
    else {
      uVar1 = (local_d8.m_control)->m_next;
      if ((uVar1 & 3) != 0) {
        pCVar3 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
        goto joined_r0x00e13f44;
      }
      (local_d8.m_control)->m_next = uVar1 | 1;
    }
    local_d8.m_queue = &local_f8;
    polymorphic_consume<density_tests::Derived2,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::consume_operation>
              (&local_d8);
    if (local_d8.m_control != (ControlBlock *)0x0) {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
      ::cancel_consume_impl(local_d8.m_queue,local_d8.m_control);
    }
    iVar4 = iVar4 + 1;
    pCVar3 = local_f8.m_head;
  } while (iVar4 != 3);
  iVar4 = 0;
  pCVar3 = local_f8.m_head;
joined_r0x00e13fa8:
  do {
    local_e8.m_control = pCVar3;
    if (local_e8.m_control == local_f8.m_tail) {
      local_e8.m_control = (ControlBlock *)0x0;
    }
    else {
      uVar1 = (local_e8.m_control)->m_next;
      if ((uVar1 & 3) != 0) {
        pCVar3 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
        goto joined_r0x00e13fa8;
      }
      (local_e8.m_control)->m_next = uVar1 | 1;
    }
    local_e8.m_queue = &local_f8;
    polymorphic_consume<density_tests::MultipleDerived,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>::reentrant_consume_operation>
              (&local_e8);
    if (local_e8.m_control != (ControlBlock *)0x0) {
      density::
      heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
      ::cancel_consume_impl(local_e8.m_queue,local_e8.m_control);
    }
    iVar4 = iVar4 + 1;
    pCVar3 = local_f8.m_head;
  } while (iVar4 != 3);
  do {
    if (pCVar3 == local_f8.m_tail) goto LAB_00e1402d;
    puVar2 = &pCVar3->m_next;
    pCVar3 = (ControlBlock *)(*puVar2 & 0xfffffffffffffff8);
  } while ((*puVar2 & 3) != 0);
  detail::assert_failed<>
            ("queue.empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
             ,0xce);
LAB_00e1402d:
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::destroy(&local_f8);
  return;
}

Assistant:

void heterogeneous_queue_basic_polymorphic_base_tests()
    {
        using namespace density;
        using RunTimeType = runtime_type<
          f_default_construct,
          f_move_construct,
          f_copy_construct,
          f_destroy,
          f_size,
          f_alignment>;
        heter_queue<RunTimeType> queue;

        queue.push(PolymorphicBase());
        queue.reentrant_emplace<SingleDerived>();
        queue.emplace<Derived1>();
        queue.reentrant_emplace<Derived2>();
        queue.emplace<MultipleDerived>();

        dynamic_push_3<PolymorphicBase>(queue);
        dynamic_push_3<SingleDerived>(queue);
        dynamic_push_3<Derived1>(queue);
        dynamic_push_3<Derived2>(queue);
        dynamic_push_3<MultipleDerived>(queue);

        int const put_count = 5 * 4;

        int elements = 0;
        for (const auto & val : queue)
        {
            (void)val;
            elements++;
        }
        DENSITY_TEST_ASSERT(elements == put_count);

        polymorphic_consume<PolymorphicBase>(queue.try_start_consume());
        polymorphic_consume<SingleDerived>(queue.try_start_reentrant_consume());
        polymorphic_consume<Derived1>(queue.try_start_consume());
        polymorphic_consume<Derived2>(queue.try_start_reentrant_consume());
        polymorphic_consume<MultipleDerived>(queue.try_start_consume());

        for (int i = 0; i < 3; i++)
            polymorphic_consume<PolymorphicBase>(queue.try_start_reentrant_consume());
        for (int i = 0; i < 3; i++)
            polymorphic_consume<SingleDerived>(queue.try_start_consume());
        for (int i = 0; i < 3; i++)
            polymorphic_consume<Derived1>(queue.try_start_reentrant_consume());
        for (int i = 0; i < 3; i++)
            polymorphic_consume<Derived2>(queue.try_start_consume());
        for (int i = 0; i < 3; i++)
            polymorphic_consume<MultipleDerived>(queue.try_start_reentrant_consume());

        DENSITY_TEST_ASSERT(queue.empty());
    }